

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ge.cpp
# Opt level: O0

void ge_p2_dbl(ge_p1p1 *r,ge_p2 *p)

{
  i32 local_48 [2];
  fe t0;
  ge_p2 *p_local;
  ge_p1p1 *r_local;
  
  fe_sq(r->X,p->X);
  fe_sq(r->Z,p->Y);
  fe_sq2(r->T,p->Z);
  fe_add(r->Y,p->X,p->Y);
  fe_sq(local_48,r->Y);
  fe_add(r->Y,r->Z,r->X);
  fe_sub(r->Z,r->Z,r->X);
  fe_sub(r->X,local_48,r->Y);
  fe_sub(r->T,r->T,r->Z);
  return;
}

Assistant:

void ge_p2_dbl(ge_p1p1 *r, const ge_p2 *p) {
    fe t0;

    fe_sq(r->X, p->X);
    fe_sq(r->Z, p->Y);
    fe_sq2(r->T, p->Z);
    fe_add(r->Y, p->X, p->Y);
    fe_sq(t0, r->Y);
    fe_add(r->Y, r->Z, r->X);
    fe_sub(r->Z, r->Z, r->X);
    fe_sub(r->X, t0, r->Y);
    fe_sub(r->T, r->T, r->Z);
}